

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O1

void __thiscall
Centaurus::ATNNode<char>::ATNNode
          (ATNNode<char> *this,ATNNode<char> *old,
          vector<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
          *transitions)

{
  pointer pwVar1;
  pointer pcVar2;
  
  this->_vptr_ATNNode = (_func_int **)&PTR__ATNNode_00185a68;
  std::vector<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>::
  vector(&this->m_transitions,transitions);
  this->m_type = old->m_type;
  (this->m_invoke)._vptr_Identifier = (_func_int **)&PTR__Identifier_00185738;
  (this->m_invoke).m_id._M_dataplus._M_p = (pointer)&(this->m_invoke).m_id.field_2;
  pwVar1 = (old->m_invoke).m_id._M_dataplus._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&(this->m_invoke).m_id,pwVar1,pwVar1 + (old->m_invoke).m_id._M_string_length
            );
  (this->m_nfa).super_NFABase<Centaurus::NFABaseState<char,_int>_>._vptr_NFABase =
       (_func_int **)&PTR__NFABase_00185af0;
  std::
  vector<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>::
  vector(&(this->m_nfa).super_NFABase<Centaurus::NFABaseState<char,_int>_>.m_states,
         &(old->m_nfa).super_NFABase<Centaurus::NFABaseState<char,_int>_>.m_states);
  (this->m_nfa).super_NFABase<Centaurus::NFABaseState<char,_int>_>._vptr_NFABase =
       (_func_int **)&PTR__NFABase_00185a98;
  (this->m_literal)._M_dataplus._M_p = (pointer)&(this->m_literal).field_2;
  pcVar2 = (old->m_literal)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_literal,pcVar2,pcVar2 + (old->m_literal)._M_string_length);
  this->m_localid = old->m_localid;
  return;
}

Assistant:

ATNNode(const ATNNode<TCHAR>& old, std::vector<ATNTransition<TCHAR> >&& transitions)
        : m_transitions(transitions), m_type(old.m_type), m_invoke(old.m_invoke), m_nfa(old.m_nfa), m_literal(old.m_literal), m_localid(old.m_localid)
    {
    }